

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::Matchers::Impl::StdString::Equals::match(Equals *this,string *expr)

{
  __type _Var1;
  string local_38;
  
  CasedString::adjustString(&local_38,&this->m_data,expr);
  _Var1 = std::operator==(&(this->m_data).m_str,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return _Var1;
}

Assistant:

virtual bool match(std::string const& expr) const {
						return m_data.m_str == m_data.adjustString(expr);;
					}